

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph.cpp
# Opt level: O2

vector<unsigned_long,_true> * __thiscall
duckdb::QueryGraphEdges::GetNeighbors
          (vector<unsigned_long,_true> *__return_storage_ptr__,QueryGraphEdges *this,
          JoinRelationSet *node,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *exclusion_set)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  result;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  local_48._M_buckets = &local_48._M_single_bucket;
  local_48._M_bucket_count = 1;
  local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48._M_element_count = 0;
  local_48._M_rehash_policy._M_max_load_factor = 1.0;
  local_48._M_rehash_policy._M_next_resize = 0;
  local_48._M_single_bucket = (__node_base_ptr)0x0;
  local_68._8_8_ = &local_48;
  local_50 = ::std::
             _Function_handler<bool_(duckdb::NeighborInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/query_graph.cpp:116:27)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<bool_(duckdb::NeighborInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/query_graph.cpp:116:27)>
             ::_M_manager;
  local_68._M_unused._M_object = exclusion_set;
  EnumerateNeighbors(this,node,(function<bool_(duckdb::NeighborInfo_&)> *)&local_68);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
  insert<std::__detail::_Node_iterator<unsigned_long,true,false>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
             (const_iterator)0x0,
             (_Node_iterator<unsigned_long,_true,_false>)local_48._M_before_begin._M_nxt,
             (_Node_iterator<unsigned_long,_true,_false>)0x0);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_48);
  return __return_storage_ptr__;
}

Assistant:

const vector<idx_t> QueryGraphEdges::GetNeighbors(JoinRelationSet &node, unordered_set<idx_t> &exclusion_set) const {
	unordered_set<idx_t> result;
	EnumerateNeighbors(node, [&](NeighborInfo &info) -> bool {
		if (!JoinRelationSetIsExcluded(info.neighbor, exclusion_set)) {
			// add the smallest node of the neighbor to the set
			result.insert(info.neighbor->relations[0]);
		}
		return false;
	});
	vector<idx_t> neighbors;
	neighbors.insert(neighbors.end(), result.begin(), result.end());
	return neighbors;
}